

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void testBitIdx(void)

{
  size_t i;
  size_t size;
  
  for (size = 1; size != 0x8000000; size = size + 1) {
    axl::sl::getAllocSize<4096ul>(size);
    axl::sl::getPowerOf2Ge64(size);
    axl::sl::getHiBit64(size);
  }
  return;
}

Assistant:

void
testBitIdx() {
	size_t size = sl::getAllocSize(0);
	ASSERT(size == 0);

	size_t x = sl::getPowerOf2Ge(0);
	ASSERT(x == 0);

	size_t y = sl::getHiBit(0);
	ASSERT(y == 0);

	size_t z = sl::getLoBit(0);
	ASSERT(z == 0);

	for (size_t i = 1; i < 128 * 1024 * 1024; i++) {
		size_t size = sl::getAllocSize(i);
		ASSERT(size >= i);

		size_t x = sl::getPowerOf2Ge(i);
		ASSERT(x >= i);

		size_t y = sl::getHiBit(i);
		ASSERT((i & y) && y <= i);

		size_t z = sl::getLoBit(i);
		ASSERT((i & z) && z <= y);
	}
}